

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

boolean is_ok_location(level *lev,schar x,schar y,int humidity)

{
  boolean bVar1;
  ulong uVar2;
  boolean bVar3;
  
  bVar1 = on_level(&lev->z,&dungeon_topology.d_water_level);
  bVar3 = '\x01';
  if ((bVar1 == '\0') &&
     ((((humidity & 1U) == 0 || (uVar2 = (ulong)(byte)lev->locations[x][y].typ, 0x26 < uVar2)) ||
      ((0x6403000000U >> (uVar2 & 0x3f) & 1) == 0)))) {
    if ((humidity & 2U) != 0) {
      bVar1 = is_pool(lev,(int)x,(int)y);
      if (bVar1 != '\0') {
        return '\x01';
      }
      bVar1 = is_lava(lev,(int)x,(int)y);
      if (bVar1 != '\0') {
        return '\x01';
      }
    }
    bVar3 = '\0';
  }
  return bVar3;
}

Assistant:

static boolean is_ok_location(struct level *lev, schar x, schar y, int humidity)
{
	int typ;

	if (Is_waterlevel(&lev->z)) return TRUE;	/* accept any spot */

	if (humidity & DRY) {
	    typ = lev->locations[x][y].typ;
	    if (typ == ROOM || typ == AIR ||
		typ == CLOUD || typ == ICE || typ == CORR)
		return TRUE;
	}
	if (humidity & WET) {
	    if (is_pool(lev, x, y) || is_lava(lev, x, y))
		return TRUE;
	}
	return FALSE;
}